

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.h
# Opt level: O1

void __thiscall libchars::edit_object::del(edit_object *this)

{
  ulong uVar1;
  ulong uVar2;
  size_t __n;
  
  uVar1 = this->buflen;
  uVar2 = this->insert_idx;
  if (uVar2 < uVar1) {
    __n = (uVar1 - 1) - uVar2;
    if (uVar2 <= uVar1 - 1 && __n != 0) {
      memmove(this->buffer + uVar2,this->buffer + uVar2 + 1,__n);
    }
    this->buffer[this->buflen - 1] = '\0';
    this->buflen = this->buflen - 1;
  }
  if ((uVar1 != 0) && (this->buflen == 0)) {
    (*this->_vptr_edit_object[2])(this);
    return;
  }
  return;
}

Assistant:

virtual void del()
        {
            size_t L = buflen;
            if (insert_idx < buflen) {
                if (insert_idx < (buflen-1)) {
                    memmove(buffer+insert_idx, buffer+insert_idx+1, buflen-1-insert_idx);
                }
                volatile char *p = buffer + buflen - 1;
                *p = 0;
                --buflen;
            }
            if (L > 0 && buflen == 0)
                emptied();
        }